

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void askPassword(arguments *args)

{
  uint uVar1;
  int iVar2;
  ssize_t sVar3;
  ulong uVar4;
  uint8_t *__dest;
  uint uVar5;
  uint8_t local_838 [1024];
  uint8_t local_438 [1032];
  
  memset(local_438,0,0x400);
  memset(local_838,0,0x400);
  do {
    sVar3 = getPassword("Enter password:",local_438,0x400,_stdin);
    uVar4 = getPassword("Confirm password:",local_838,0x400,_stdin);
    uVar5 = (uint)sVar3 & 0xffff;
    uVar1 = (uint)uVar4 & 0xffff;
    if (uVar1 < 6 || uVar5 < 6) {
      puts("Password must be at least 6 characters in length");
    }
    else {
      if (uVar5 == uVar1) {
        iVar2 = bcmp(local_438,local_838,uVar4 & 0xffff);
        if (iVar2 == 0) {
          puts("Password accepted");
          uVar4 = uVar4 & 0xffff;
          __dest = (uint8_t *)calloc(uVar4 + 1,1);
          args->password = __dest;
          memcpy(__dest,local_838,uVar4);
          args->field_0x3c = args->field_0x3c | 2;
          args->pw_length = uVar4;
          return;
        }
      }
      memset(local_438,0,0x400);
      memset(local_838,0,0x400);
    }
    puts("Passwords do not match");
  } while( true );
}

Assistant:

void askPassword(arguments* args)
{
    bool first = true;
    bool match = false;
    const static uint8_t pw_prompt[] = 
    { 
        'E', 'n', 't', 'e', 'r', ' ', 'p', 'a', 's', 's', 'w', 'o', 'r', 'd', ':', '\0'
    };
    const static uint8_t conf_prompt[] = 
    {
        'C', 'o', 'n', 'f', 'i', 'r', 'm', ' ', 'p', 'a', 's', 's', 'w', 'o', 'r', 'd',
        ':', '\0'
    };

    uint8_t pw1[BUFF_SIZE] = { 0 };
    uint8_t pw2[BUFF_SIZE] = { 0 };
    uint16_t pw1_len = 0;
    uint16_t pw2_len = 0;
 
    while (match == false) //TODO find a portable way to do this
    {
        if (!first) { printf("Passwords do not match\n"); }

        first = false;

        pw1_len = getPassword((uint8_t*)pw_prompt, pw1, BUFF_SIZE, stdin);
        pw2_len = getPassword((uint8_t*)conf_prompt, pw2, BUFF_SIZE, stdin);

        if (pw1_len < 6 || pw2_len < 6) { printf("Password must be at least 6 characters in length\n"); } 
        else if ((pw1_len == pw2_len) && memcmp(pw1, pw2, pw2_len) == 0) { match = true; }
        else //clear buffers from failed pw attempts
        {
            zeroFill(pw1, BUFF_SIZE);
            zeroFill(pw2, BUFF_SIZE);
        }
    }

    printf("Password accepted\n");
    args->password = calloc(pw2_len+1, sizeof(uint8_t));
    memcpy(args->password, pw2, pw2_len);
    args->free = true; //set the flag to free it since we allocated memory for this pw
    args->pw_length = pw2_len; //ad the pw length to the arguments structure

    //zero_fill the temp pw_buffers
    zeroFill(pw1, BUFF_SIZE);
    zeroFill(pw2, BUFF_SIZE);
    pd3("password set to: %s\n", args->password);
}